

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_check_wildcard(char *cn,mbedtls_x509_buf *name)

{
  long lVar1;
  byte bVar2;
  uchar *puVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  
  sVar4 = strlen(cn);
  iVar6 = 0;
  if (((2 < name->len) && (puVar3 = name->p, *puVar3 == '*')) && (puVar3[1] == '.')) {
    if (sVar4 != 0) {
      sVar7 = 0;
      do {
        if (cn[sVar7] == '.') {
          if ((sVar7 != 0) && (~sVar4 + name->len + sVar7 == 0)) {
            lVar5 = 0;
            while( true ) {
              bVar2 = puVar3[lVar5 + 1];
              if ((bVar2 != cn[sVar7 + lVar5]) &&
                 (((byte)(cn[sVar7 + lVar5] ^ bVar2) != 0x20 ||
                  (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))))) break;
              lVar1 = (sVar7 - sVar4) + lVar5;
              lVar5 = lVar5 + 1;
              if (lVar1 == -1) {
                return 0;
              }
            }
          }
          break;
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != sVar4);
    }
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int x509_check_wildcard( const char *cn, mbedtls_x509_buf *name )
{
    size_t i;
    size_t cn_idx = 0, cn_len = strlen( cn );

    if( name->len < 3 || name->p[0] != '*' || name->p[1] != '.' )
        return( 0 );

    for( i = 0; i < cn_len; ++i )
    {
        if( cn[i] == '.' )
        {
            cn_idx = i;
            break;
        }
    }

    if( cn_idx == 0 )
        return( -1 );

    if( cn_len - cn_idx == name->len - 1 &&
        x509_memcasecmp( name->p + 1, cn + cn_idx, name->len - 1 ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}